

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long *plVar1;
  tuple<StateMachine_*,_std::default_delete<StateMachine>_> this;
  ostream *poVar2;
  long *plVar3;
  __single_object spSTM;
  shared_ptr<Status> spExecStatus;
  shared_ptr<Data> spData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  resultingStatus;
  __uniq_ptr_impl<StateMachine,_std::default_delete<StateMachine>_> local_88;
  shared_ptr<Status> local_80;
  shared_ptr<Data> local_70;
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
       1;
  (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count =
       1;
  (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00106d20;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count =
       0;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count =
       0;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)
   &local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_use_count
       = 1;
  local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x1;
  local_80.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Status *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Status,std::allocator<Status>>
            (&local_80.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Status **)&local_80,(allocator<Status> *)&local_60);
  this.super__Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>.
  super__Head_base<0UL,_StateMachine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>)operator_new(0x80);
  StateMachine::StateMachine
            ((StateMachine *)
             this.super__Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>.
             super__Head_base<0UL,_StateMachine_*,_false>._M_head_impl,&local_70,&local_80);
  local_88._M_t.super__Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>.
  super__Head_base<0UL,_StateMachine_*,_false>._M_head_impl =
       (tuple<StateMachine_*,_std::default_delete<StateMachine>_>)
       (tuple<StateMachine_*,_std::default_delete<StateMachine>_>)
       this.super__Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>.
       super__Head_base<0UL,_StateMachine_*,_false>._M_head_impl;
  StateMachine::runSTM
            ((StateMachine *)
             this.super__Tuple_impl<0UL,_StateMachine_*,_std::default_delete<StateMachine>_>.
             super__Head_base<0UL,_StateMachine_*,_false>._M_head_impl);
  Status::getStatusMessage_abi_cxx11_
            (local_80.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  plVar3 = (long *)*local_40;
  plVar1 = (long *)local_40[1];
  if (plVar3 != plVar1) {
    do {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>((string *)&local_60,*plVar3,plVar3[1] + *plVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_60,local_58);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      plVar3 = plVar3 + 4;
    } while (plVar3 != plVar1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  std::unique_ptr<StateMachine,_std::default_delete<StateMachine>_>::~unique_ptr
            ((unique_ptr<StateMachine,_std::default_delete<StateMachine>_> *)&local_88);
  if (local_80.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return 0;
}

Assistant:

int main()
{
    
    auto spData{ std::make_shared<Data>() };
    auto spExecStatus{ std::make_shared<Status>() };
    auto spSTM{ std::make_unique<StateMachine>(spData, spExecStatus) };

    spSTM->runSTM();
    
    auto resultingStatus = spExecStatus->getStatusMessage();
    for(auto message : *(resultingStatus.get()) )
    {
        std::cout << message << std::endl;
    }
    return 0;

}